

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts_tclap.cpp
# Opt level: O1

TEvalOpts * ParseOptions(TEvalOpts *__return_storage_ptr__,int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  int argc_00;
  char **argv_00;
  SwitchArg noDenormalsArg;
  SwitchArg exactArg;
  SwitchArg useDoubleArg;
  SwitchArg printArg;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> archArg
  ;
  ValueArg<unsigned_long> nArg;
  ValueArg<float> maxArg;
  ValueArg<float> minArg;
  CmdLine cmd;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> funcArg
  ;
  string local_910;
  int local_8ec;
  string local_8e8;
  char **local_8c8;
  undefined1 local_8c0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8a8;
  _Alloc_hider local_898;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_888;
  _Alloc_hider local_878;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_868;
  _Alloc_hider local_850;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_840 [2];
  undefined2 local_81d;
  undefined1 local_818 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_800;
  _Alloc_hider local_7f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7e0;
  _Alloc_hider local_7d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c0;
  _Alloc_hider local_7a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_798 [2];
  undefined2 local_775;
  undefined1 local_770 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_758;
  _Alloc_hider local_748;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_738;
  _Alloc_hider local_728;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_718;
  _Alloc_hider local_700;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f0 [2];
  undefined2 local_6cd;
  string local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  undefined1 local_668 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_650;
  _Alloc_hider local_640;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_630;
  _Alloc_hider local_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_610;
  _Alloc_hider local_5f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8 [2];
  undefined2 local_5c5;
  undefined1 local_5c0 [272];
  undefined1 local_4b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  _Alloc_hider local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  _Alloc_hider local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  _Alloc_hider local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430 [2];
  size_t local_408;
  _Alloc_hider local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  undefined1 local_3d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  _Alloc_hider local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  _Alloc_hider local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  _Alloc_hider local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350 [2];
  float local_32c;
  _Alloc_hider local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  undefined1 local_2f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Alloc_hider local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  _Alloc_hider local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [2];
  float local_254;
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  CmdLine local_220;
  undefined1 local_140 [272];
  
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"Compute <count> values of a <func> in [<min>, <max>] interval","")
  ;
  pcVar3 = local_5c0 + 0x10;
  local_5c0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"none","");
  TCLAP::CmdLine::CmdLine(&local_220,(string *)local_140,' ',(string *)local_5c0,true);
  if ((pointer)local_5c0._0_8_ != pcVar3) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"");
  pcVar3 = local_4b0 + 0x10;
  local_4b0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"func","");
  local_8ec = argc;
  local_2f8._0_8_ = local_2f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2f8,"exp or log or sigm or tanh","");
  local_8c8 = argv;
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,"exp","");
  pcVar4 = local_3d0 + 0x10;
  local_3d0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"exp|log|sigm|tanh","");
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_140,(string *)local_5c0,(string *)local_4b0,(string *)local_2f8,true,
             &local_688,(string *)local_3d0,(Visitor *)0x0);
  if ((pointer)local_3d0._0_8_ != pcVar4) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
  }
  pcVar5 = local_5c0 + 0x10;
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar5) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  (*local_220.super_CmdLineInterface._vptr_CmdLineInterface[3])(&local_220,local_140);
  local_5c0._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"");
  local_4b0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"min","");
  local_3d0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3d0,"Lower boundary of an interval, default is -100.0","");
  pcVar6 = local_818 + 0x10;
  local_818._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_818,"FLOAT","");
  TCLAP::ValueArg<float>::ValueArg
            ((ValueArg<float> *)local_2f8,(string *)local_5c0,(string *)local_4b0,
             (string *)local_3d0,false,-100.0,(string *)local_818,(Visitor *)0x0);
  if ((pointer)local_818._0_8_ != pcVar6) {
    operator_delete((void *)local_818._0_8_,local_818._16_8_ + 1);
  }
  if ((pointer)local_3d0._0_8_ != pcVar4) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar5) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  (*local_220.super_CmdLineInterface._vptr_CmdLineInterface[3])(&local_220,local_2f8);
  local_5c0._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"");
  local_4b0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"max","");
  local_818._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_818,"Upper boundary of an interval, default is 100.0","");
  pcVar4 = local_8c0 + 0x10;
  local_8c0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"FLOAT","");
  TCLAP::ValueArg<float>::ValueArg
            ((ValueArg<float> *)local_3d0,(string *)local_5c0,(string *)local_4b0,
             (string *)local_818,false,100.0,(string *)local_8c0,(Visitor *)0x0);
  if ((pointer)local_8c0._0_8_ != pcVar4) {
    operator_delete((void *)local_8c0._0_8_,local_8c0._16_8_ + 1);
  }
  if ((pointer)local_818._0_8_ != pcVar6) {
    operator_delete((void *)local_818._0_8_,local_818._16_8_ + 1);
  }
  if ((pointer)local_4b0._0_8_ != pcVar3) {
    operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar5) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  (*local_220.super_CmdLineInterface._vptr_CmdLineInterface[3])(&local_220,local_3d0);
  local_5c0._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"c","");
  local_818._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_818,"count","");
  local_8c0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8c0,"Number of values to compute, default is 1000","");
  pcVar3 = local_770 + 0x10;
  local_770._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_770,"N","");
  TCLAP::ValueArg<unsigned_long>::ValueArg
            ((ValueArg<unsigned_long> *)local_4b0,(string *)local_5c0,(string *)local_818,
             (string *)local_8c0,false,1000,(string *)local_770,(Visitor *)0x0);
  if ((pointer)local_770._0_8_ != pcVar3) {
    operator_delete((void *)local_770._0_8_,local_770._16_8_ + 1);
  }
  if ((pointer)local_8c0._0_8_ != pcVar4) {
    operator_delete((void *)local_8c0._0_8_,local_8c0._16_8_ + 1);
  }
  if ((pointer)local_818._0_8_ != pcVar6) {
    operator_delete((void *)local_818._0_8_,local_818._16_8_ + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar5) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  (*local_220.super_CmdLineInterface._vptr_CmdLineInterface[3])(&local_220,local_4b0);
  local_818._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_818,"");
  local_8c0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"arch","");
  local_770._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_770,"Target archicture: plain or avx or avx2, default is avx2","");
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"avx2","");
  pcVar4 = local_668 + 0x10;
  local_668._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_668,"plain|avx|avx2","");
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_5c0,(string *)local_818,(string *)local_8c0,(string *)local_770,false,
             &local_6a8,(string *)local_668,(Visitor *)0x0);
  if ((pointer)local_668._0_8_ != pcVar4) {
    operator_delete((void *)local_668._0_8_,local_668._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_770._0_8_ != pcVar3) {
    operator_delete((void *)local_770._0_8_,local_770._16_8_ + 1);
  }
  if ((undefined1 *)local_8c0._0_8_ != local_8c0 + 0x10) {
    operator_delete((void *)local_8c0._0_8_,local_8c0._16_8_ + 1);
  }
  if ((pointer)local_818._0_8_ != pcVar6) {
    operator_delete((void *)local_818._0_8_,local_818._16_8_ + 1);
  }
  (*local_220.super_CmdLineInterface._vptr_CmdLineInterface[3])(&local_220,local_5c0);
  local_8c0._0_8_ = local_8c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"");
  local_770._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_770,"exact","");
  local_668._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_668,"Use exact version (slower)","");
  TCLAP::Arg::Arg((Arg *)local_818,(string *)local_8c0,(string *)local_770,(string *)local_668,false
                  ,false,(Visitor *)0x0);
  local_818._0_8_ = &PTR__Arg_0013e8e8;
  local_775 = 0;
  (*local_220.super_CmdLineInterface._vptr_CmdLineInterface[3])();
  if ((pointer)local_668._0_8_ != pcVar4) {
    operator_delete((void *)local_668._0_8_,local_668._16_8_ + 1);
  }
  if ((pointer)local_770._0_8_ != pcVar3) {
    operator_delete((void *)local_770._0_8_,local_770._16_8_ + 1);
  }
  if ((undefined1 *)local_8c0._0_8_ != local_8c0 + 0x10) {
    operator_delete((void *)local_8c0._0_8_,local_8c0._16_8_ + 1);
  }
  local_770._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_770,"");
  local_668._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_668,"nodenorm","");
  paVar1 = &local_910.field_2;
  local_910._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"Don\'t honor denormals","");
  TCLAP::Arg::Arg((Arg *)local_8c0,(string *)local_770,(string *)local_668,&local_910,false,false,
                  (Visitor *)0x0);
  local_8c0._0_8_ = &PTR__Arg_0013e8e8;
  local_81d = 0;
  (*local_220.super_CmdLineInterface._vptr_CmdLineInterface[3])();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._M_dataplus._M_p != paVar1) {
    operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_668._0_8_ != pcVar4) {
    operator_delete((void *)local_668._0_8_,local_668._16_8_ + 1);
  }
  if ((pointer)local_770._0_8_ != pcVar3) {
    operator_delete((void *)local_770._0_8_,local_770._16_8_ + 1);
  }
  local_668._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_668,"");
  local_910._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"double","");
  paVar2 = &local_8e8.field_2;
  local_8e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8e8,"Use double precision, single precision is used by default","");
  TCLAP::Arg::Arg((Arg *)local_770,(string *)local_668,&local_910,&local_8e8,false,false,
                  (Visitor *)0x0);
  local_770._0_8_ = &PTR__Arg_0013e8e8;
  local_6cd = 0;
  (*local_220.super_CmdLineInterface._vptr_CmdLineInterface[3])();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_8e8._M_dataplus._M_p,local_8e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._M_dataplus._M_p != paVar1) {
    operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_668._0_8_ != pcVar4) {
    operator_delete((void *)local_668._0_8_,local_668._16_8_ + 1);
  }
  local_910._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"");
  local_8e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e8,"print","");
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"");
  TCLAP::Arg::Arg((Arg *)local_668,&local_910,&local_8e8,&local_6c8,false,false,(Visitor *)0x0);
  local_668._0_8_ = &PTR__Arg_0013e8e8;
  local_5c5 = 0;
  (*local_220.super_CmdLineInterface._vptr_CmdLineInterface[3])();
  argv_00 = local_8c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  argc_00 = local_8ec;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_8e8._M_dataplus._M_p,local_8e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._M_dataplus._M_p != paVar1) {
    operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
  }
  TCLAP::CmdLine::parse(&local_220,argc_00,argv_00);
  (__return_storage_ptr__->Func)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Func).field_2
  ;
  (__return_storage_ptr__->Func)._M_string_length = 0;
  (__return_storage_ptr__->Func).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Arch)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Arch).field_2
  ;
  (__return_storage_ptr__->Arch)._M_string_length = 0;
  (__return_storage_ptr__->Arch).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->Lo = local_254;
  __return_storage_ptr__->Hi = local_32c;
  __return_storage_ptr__->N = local_408;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->Arch);
  __return_storage_ptr__->Exact = local_775._0_1_;
  __return_storage_ptr__->NoDenormals = local_81d._0_1_;
  __return_storage_ptr__->UseDouble = local_6cd._0_1_;
  __return_storage_ptr__->Print = local_5c5._0_1_;
  local_668._0_8_ = &PTR__Arg_0013e790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_p != local_5e8) {
    operator_delete(local_5f8._M_p,local_5e8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620._M_p != &local_610) {
    operator_delete(local_620._M_p,local_610._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_p != &local_630) {
    operator_delete(local_640._M_p,local_630._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._8_8_ != &local_650) {
    operator_delete((void *)local_668._8_8_,local_650._0_8_ + 1);
  }
  local_770._0_8_ = &PTR__Arg_0013e790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_p != local_6f0) {
    operator_delete(local_700._M_p,local_6f0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_p != &local_718) {
    operator_delete(local_728._M_p,local_718._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_p != &local_738) {
    operator_delete(local_748._M_p,local_738._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._8_8_ != &local_758) {
    operator_delete((void *)local_770._8_8_,local_758._0_8_ + 1);
  }
  local_8c0._0_8_ = &PTR__Arg_0013e790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850._M_p != local_840) {
    operator_delete(local_850._M_p,local_840[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_p != &local_868) {
    operator_delete(local_878._M_p,local_868._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_p != &local_888) {
    operator_delete(local_898._M_p,local_888._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0._8_8_ != &local_8a8) {
    operator_delete((void *)local_8c0._8_8_,local_8a8._0_8_ + 1);
  }
  local_818._0_8_ = &PTR__Arg_0013e790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_p != local_798) {
    operator_delete(local_7a8._M_p,local_798[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_p != &local_7c0) {
    operator_delete(local_7d0._M_p,local_7c0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_p != &local_7e0) {
    operator_delete(local_7f0._M_p,local_7e0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._8_8_ != &local_800) {
    operator_delete((void *)local_818._8_8_,local_800._0_8_ + 1);
  }
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_5c0);
  local_4b0._0_8_ = &PTR__ValueArg_0013ec50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_p != &local_3e8) {
    operator_delete(local_3f8._M_p,local_3e8._M_allocated_capacity + 1);
  }
  local_4b0._0_8_ = &PTR__Arg_0013e790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_p != local_430) {
    operator_delete(local_440._M_p,local_430[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_p != &local_458) {
    operator_delete(local_468._M_p,local_458._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_p != &local_478) {
    operator_delete(local_488._M_p,local_478._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._8_8_ != &local_498) {
    operator_delete((void *)local_4b0._8_8_,local_498._0_8_ + 1);
  }
  local_3d0._0_8_ = &PTR__ValueArg_0013ed18;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_p != &local_310) {
    operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
  }
  local_3d0._0_8_ = &PTR__Arg_0013e790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_p != local_350) {
    operator_delete(local_360._M_p,local_350[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_p != &local_378) {
    operator_delete(local_388._M_p,local_378._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_p != &local_398) {
    operator_delete(local_3a8._M_p,local_398._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._8_8_ != &local_3b8) {
    operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
  }
  local_2f8._0_8_ = &PTR__ValueArg_0013ed18;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_p != &local_238) {
    operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
  }
  local_2f8._0_8_ = &PTR__Arg_0013e790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_p != local_278) {
    operator_delete(local_288._M_p,local_278[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_p != &local_2a0) {
    operator_delete(local_2b0._M_p,local_2a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_p != &local_2c0) {
    operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,local_2e0._0_8_ + 1);
  }
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_140);
  TCLAP::CmdLine::~CmdLine(&local_220);
  return __return_storage_ptr__;
}

Assistant:

TEvalOpts ParseOptions(int argc, char** argv) {
    TCLAP::CmdLine cmd("Compute <count> values of a <func> in [<min>, <max>] interval");
    TCLAP::ValueArg<std::string> funcArg("", "func", "exp or log or sigm or tanh", true, "exp", "exp|log|sigm|tanh");
    cmd.add(funcArg);
    TCLAP::ValueArg<float> minArg("", "min", "Lower boundary of an interval, default is -100.0", false, -100.0, "FLOAT");
    cmd.add(minArg);
    TCLAP::ValueArg<float> maxArg("", "max", "Upper boundary of an interval, default is 100.0", false, 100.0, "FLOAT");
    cmd.add(maxArg);
    TCLAP::ValueArg<size_t> nArg("c", "count", "Number of values to compute, default is 1000", false, 1000, "N");
    cmd.add(nArg);
    TCLAP::ValueArg<std::string> archArg("", "arch", "Target archicture: plain or avx or avx2, default is avx2", false, "avx2", "plain|avx|avx2");
    cmd.add(archArg);
    TCLAP::SwitchArg exactArg("", "exact", "Use exact version (slower)", cmd, false);
    TCLAP::SwitchArg noDenormalsArg("", "nodenorm", "Don't honor denormals", cmd, false);
    TCLAP::SwitchArg useDoubleArg("", "double", "Use double precision, single precision is used by default", cmd, false);
    TCLAP::SwitchArg printArg("", "print", "", cmd, false);
    cmd.parse(argc, argv);

    TEvalOpts res; 

    res.Func = funcArg.getValue();
    res.Lo = minArg.getValue();
    res.Hi = maxArg.getValue();
    res.N = nArg.getValue();
    res.Arch = archArg.getValue();
    res.Exact = exactArg.getValue();
    res.NoDenormals = noDenormalsArg.getValue();
    res.UseDouble = useDoubleArg.getValue();
    res.Print = printArg.getValue();

    return res;
}